

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandInter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  char *pcVar8;
  uint fVerbose;
  uint fRelation;
  Abc_Ntk_t *pNtk2;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk1;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  pAVar4 = Abc_FrameReadNtk(pAbc);
  fRelation = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"rvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x72) {
      Abc_Print(-2,"usage: inter [-rvh] <onset.blif> <offset.blif>\n");
      Abc_Print(-2,"\t         derives interpolant of two networks representing onset and offset;\n"
               );
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (fRelation == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle computing interpolant as a relation [default = %s]\n",pcVar7);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t         \n");
      Abc_Print(-2,"\t         Comments:\n");
      Abc_Print(-2,"\t         \n");
      Abc_Print(-2,
                "\t         The networks given on the command line should have the same CIs/COs.\n")
      ;
      Abc_Print(-2,"\t         If only one network is given on the command line, this network\n");
      Abc_Print(-2,
                "\t         is assumed to be the offset, while the current network is the onset.\n")
      ;
      Abc_Print(-2,"\t         If no network is given on the command line, the current network is\n"
               );
      Abc_Print(-2,
                "\t         assumed to be the onset and its complement is taken to be the offset.\n"
               );
      Abc_Print(-2,"\t         The resulting interpolant is stored as the current network.\n");
      Abc_Print(-2,
                "\t         To verify that the interpolant agrees with the onset and the offset,\n")
      ;
      Abc_Print(-2,"\t         save it in file \"inter.blif\" and run the following:\n");
      Abc_Print(-2,"\t         (a) \"miter -i <onset.blif> <inter.blif>; iprove\"\n");
      Abc_Print(-2,"\t         (b) \"miter -i <inter.blif> <offset_inv.blif>; iprove\"\n");
      Abc_Print(-2,
                "\t         where <offset_inv.blif> is the network derived by complementing the\n");
      Abc_Print(-2,
                "\t         outputs of <offset.blif>: \"r <offset.blif>; st -i; w <offset_inv.blif>\"\n"
               );
      return 1;
    }
    fRelation = fRelation ^ 1;
  }
  iVar3 = Abc_NtkPrepareTwoNtks
                    (_stdout,pAVar4,argv + globalUtilOptind,argc - globalUtilOptind,&pNtk1,&pNtk2,
                     &fDelete1,&fDelete2);
  if (iVar3 == 0) {
    return 1;
  }
  if (argc == iVar2) {
    Abc_Print(-1,"Deriving new circuit structure for the current network.\n");
    pVVar6 = pNtk2->vPos;
    if (0 < pVVar6->nSize) {
      lVar5 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar5] + 0x14);
        *puVar1 = *puVar1 ^ 0x400;
        lVar5 = lVar5 + 1;
        pVVar6 = pNtk2->vPos;
      } while (lVar5 < pVVar6->nSize);
    }
  }
  if ((fRelation == 0) || (pNtk1->vCos->nSize == 1)) {
    pAVar4 = Abc_NtkInter(pNtk1,pNtk2,fRelation,fVerbose);
  }
  else {
    pAVar4 = (Abc_Ntk_t *)0x0;
    Abc_Print(-1,
              "Computation of interplants as a relation only works for single-output functions.\n");
    Abc_Print(-1,"Use command \"cone\" to extract one output cone from the multi-output network.\n")
    ;
  }
  if (fDelete1 != 0) {
    Abc_NtkDelete(pNtk1);
  }
  if (fDelete2 != 0) {
    Abc_NtkDelete(pNtk2);
  }
  if (pAVar4 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Command has failed.\n");
    return 0;
  }
  Abc_FrameReplaceCurrentNetwork(local_38,pAVar4);
  return 0;
}

Assistant:

int Abc_CommandInter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2, * pNtkRes = NULL;
    char ** pArgvNew;
    int nArgcNew;
    int c, fDelete1, fDelete2;
    int fRelation;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkInter( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fRelation = 0;
    fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'r':
            fRelation ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
    if ( nArgcNew == 0 )
    {
        Abc_Obj_t * pObj;
        int i;
        Abc_Print( -1, "Deriving new circuit structure for the current network.\n" );
        Abc_NtkForEachPo( pNtk2, pObj, i )
            Abc_ObjXorFaninC( pObj, 0 );
    }
    if ( fRelation && Abc_NtkCoNum(pNtk1) != 1 )
    {
        Abc_Print( -1, "Computation of interplants as a relation only works for single-output functions.\n" );
        Abc_Print( -1, "Use command \"cone\" to extract one output cone from the multi-output network.\n" );
    }
    else
        pNtkRes = Abc_NtkInter( pNtk1, pNtk2, fRelation, fVerbose );
    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );

    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: inter [-rvh] <onset.blif> <offset.blif>\n" );
    Abc_Print( -2, "\t         derives interpolant of two networks representing onset and offset;\n" );
    Abc_Print( -2, "\t-r     : toggle computing interpolant as a relation [default = %s]\n", fRelation? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t         \n" );
    Abc_Print( -2, "\t         Comments:\n" );
    Abc_Print( -2, "\t         \n" );
    Abc_Print( -2, "\t         The networks given on the command line should have the same CIs/COs.\n" );
    Abc_Print( -2, "\t         If only one network is given on the command line, this network\n" );
    Abc_Print( -2, "\t         is assumed to be the offset, while the current network is the onset.\n" );
    Abc_Print( -2, "\t         If no network is given on the command line, the current network is\n" );
    Abc_Print( -2, "\t         assumed to be the onset and its complement is taken to be the offset.\n" );
    Abc_Print( -2, "\t         The resulting interpolant is stored as the current network.\n" );
    Abc_Print( -2, "\t         To verify that the interpolant agrees with the onset and the offset,\n" );
    Abc_Print( -2, "\t         save it in file \"inter.blif\" and run the following:\n" );
    Abc_Print( -2, "\t         (a) \"miter -i <onset.blif> <inter.blif>; iprove\"\n" );
    Abc_Print( -2, "\t         (b) \"miter -i <inter.blif> <offset_inv.blif>; iprove\"\n" );
    Abc_Print( -2, "\t         where <offset_inv.blif> is the network derived by complementing the\n" );
    Abc_Print( -2, "\t         outputs of <offset.blif>: \"r <offset.blif>; st -i; w <offset_inv.blif>\"\n" );
    return 1;
}